

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O0

QString * queryHarfbuzz<QFontEngine::glyphName(unsigned_int)const::__0>
                    (QFontEngine *engine,anon_class_4_1_a81517f2 *func)

{
  hb_face_t *this;
  hb_font_t *hbFont_00;
  QString *in_RDI;
  long in_FS_OFFSET;
  hb_font_t *hbFont;
  hb_face_t *hbFace;
  QString result;
  QFontEngine *in_stack_ffffffffffffff88;
  QString *this_00;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QString::QString((QString *)0x76011c);
  this = hb_qt_face_get_for_engine(in_stack_ffffffffffffff88);
  hbFont_00 = (hb_font_t *)hb_font_create(this);
  if (hbFont_00 != (hb_font_t *)0x0) {
    hb_ot_font_set_funcs(hbFont_00);
    QFontEngine::glyphName::anon_class_4_1_a81517f2::operator()
              ((anon_class_4_1_a81517f2 *)this,hbFont_00);
    QString::operator=(this_00,(QString *)in_stack_ffffffffffffff88);
    QString::~QString((QString *)0x760179);
    hb_font_destroy(hbFont_00);
  }
  QString::QString(this_00,&local_20);
  QString::~QString((QString *)0x76019f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

auto queryHarfbuzz(const QFontEngine *engine, Functor &&func)
{
    decltype(func(nullptr)) result = {};

    hb_face_t *hbFace = hb_qt_face_get_for_engine(const_cast<QFontEngine *>(engine));
    if (hb_font_t *hbFont = hb_font_create(hbFace)) {
        // explicitly use OpenType handlers for this font
        hb_ot_font_set_funcs(hbFont);

        result = func(hbFont);

        hb_font_destroy(hbFont);
    }

    return result;
}